

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeGlobalSet(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  size_t sVar2;
  iterator iVar3;
  value_type *pvVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  key_type local_30;
  Type type_local;
  
  local_30.id = type.id;
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xae5,"Expression *wasm::TranslateToFuzzReader::makeGlobalSet(Type)");
  }
  local_30.id = (uintptr_t)getConcreteType(this);
  iVar3 = std::
          _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mutableGlobalsByType)._M_h,&local_30);
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
       ._M_cur == (__node_type *)0x0) ||
     (*(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                      ._M_cur + 0x10) ==
      *(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                      ._M_cur + 0x18))) {
    pEVar6 = makeTrivial(this,(Type)0x0);
  }
  else {
    pvVar4 = Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                       (&this->random,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                        ((long)iVar3.
                               super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                               ._M_cur + 0x10));
    pcVar1 = (pvVar4->super_IString).str._M_str;
    if (pcVar1 == (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str) {
      __assert_fail("name != HANG_LIMIT_GLOBAL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xaee,"Expression *wasm::TranslateToFuzzReader::makeGlobalSet(Type)");
    }
    sVar2 = (pvVar4->super_IString).str._M_len;
    pEVar5 = make(this,(Type)local_30.id);
    pEVar6 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8);
    pEVar6->_id = GlobalSetId;
    (pEVar6->type).id = 0;
    *(undefined8 *)(pEVar6 + 1) = 0;
    *(size_t *)(pEVar6 + 1) = sVar2;
    pEVar6[1].type.id = (uintptr_t)pcVar1;
    *(Expression **)(pEVar6 + 2) = pEVar5;
    wasm::GlobalSet::finalize();
  }
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeGlobalSet(Type type) {
  assert(type == Type::none);
  type = getConcreteType();
  auto it = mutableGlobalsByType.find(type);
  if (it == mutableGlobalsByType.end() || it->second.empty()) {
    return makeTrivial(Type::none);
  }

  auto name = pick(it->second);
  // We don't want random fuzz code to use the hang limit global.
  assert(name != HANG_LIMIT_GLOBAL);
  return builder.makeGlobalSet(name, make(type));
}